

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umapfile.cpp
# Opt level: O0

void uprv_unmapFile_63(UDataMemory *pData)

{
  size_t dataLen;
  UDataMemory *pData_local;
  
  if ((pData != (UDataMemory *)0x0) && (pData->map != (void *)0x0)) {
    munmap(pData->mapAddr,(long)pData->map - (long)pData->mapAddr);
    pData->pHeader = (DataHeader *)0x0;
    pData->map = (void *)0x0;
    pData->mapAddr = (void *)0x0;
  }
  return;
}

Assistant:

U_CFUNC void
    uprv_unmapFile(UDataMemory *pData) {
        if(pData!=NULL && pData->map!=NULL) {
            size_t dataLen = (char *)pData->map - (char *)pData->mapAddr;
            if(munmap(pData->mapAddr, dataLen)==-1) {
            }
            pData->pHeader=NULL;
            pData->map=0;
            pData->mapAddr=NULL;
        }
    }